

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.h
# Opt level: O2

void __thiscall asmjit::v1_14::ZoneBitVector::release(ZoneBitVector *this,ZoneAllocator *allocator)

{
  if (*(void **)this != (void *)0x0) {
    ZoneAllocator::release(allocator,*(void **)this,(ulong)(*(uint *)(this + 0xc) >> 3));
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  return;
}

Assistant:

inline void release(ZoneAllocator* allocator) noexcept {
    if (!_data)
      return;
    allocator->release(_data, _capacity / 8);
    reset();
  }